

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTessellationShaderTCTE.cpp
# Opt level: O3

void __thiscall
glcts::TessellationShaderTCTEgl_MaxPatchVertices_Position_PointSize::
TessellationShaderTCTEgl_MaxPatchVertices_Position_PointSize
          (TessellationShaderTCTEgl_MaxPatchVertices_Position_PointSize *this,Context *context,
          ExtParameters *extParams)

{
  TestCaseBase::TestCaseBase
            (&this->super_TestCaseBase,context,extParams,"gl_MaxPatchVertices_Position_PointSize",
             "Verifies gl_Position and gl_PointSize (if supported) are set to correct values in TE stage. Checks if up to gl_MaxPatchVertices input block values can be accessed from TE stage. Also verifies if TC/TE stage properties can be correctly queried for both regular and separate program objects."
            );
  (this->super_TestCaseBase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__TessellationShaderTCTEgl_MaxPatchVertices_Position_PointSize_021135a0;
  this->m_bo_id = 0;
  this->m_gl_max_patch_vertices_value = 0;
  this->m_gl_max_tess_gen_level_value = 0;
  (this->m_runs).
  super__Vector_base<glcts::TessellationShaderTCTEgl_MaxPatchVertices_Position_PointSize::_run,_std::allocator<glcts::TessellationShaderTCTEgl_MaxPatchVertices_Position_PointSize::_run>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_runs).
  super__Vector_base<glcts::TessellationShaderTCTEgl_MaxPatchVertices_Position_PointSize::_run,_std::allocator<glcts::TessellationShaderTCTEgl_MaxPatchVertices_Position_PointSize::_run>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_runs).
  super__Vector_base<glcts::TessellationShaderTCTEgl_MaxPatchVertices_Position_PointSize::_run,_std::allocator<glcts::TessellationShaderTCTEgl_MaxPatchVertices_Position_PointSize::_run>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->m_utils_ptr = (TessellationShaderUtils *)0x0;
  this->m_vao_id = 0;
  return;
}

Assistant:

TessellationShaderTCTEgl_MaxPatchVertices_Position_PointSize::
	TessellationShaderTCTEgl_MaxPatchVertices_Position_PointSize(Context& context, const ExtParameters& extParams)
	: TestCaseBase(context, extParams, "gl_MaxPatchVertices_Position_PointSize",
				   "Verifies gl_Position and gl_PointSize (if supported) "
				   "are set to correct values in TE stage. Checks if up to "
				   "gl_MaxPatchVertices input block values can be accessed "
				   "from TE stage. Also verifies if TC/TE stage properties "
				   "can be correctly queried for both regular and separate "
				   "program objects.")
	, m_bo_id(0)
	, m_gl_max_patch_vertices_value(0)
	, m_gl_max_tess_gen_level_value(0)
	, m_utils_ptr(DE_NULL)
	, m_vao_id(0)
{
	/* Left blank on purpose */
}